

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  AV1_COMP *cpi;
  uint *in_RSI;
  YV12_BUFFER_CONFIG new_frame;
  aom_image_t *new_img;
  YV12_BUFFER_CONFIG local_f0;
  AV1_PRIMARY *local_20;
  aom_codec_err_t local_4;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    cpi = (AV1_COMP *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    cpi = *(AV1_COMP **)(in_RSI + 2);
    *(undefined1 **)(in_RSI + 2) = &cpi->field_0x8;
  }
  local_20 = cpi->ppi;
  if (local_20 == (AV1_PRIMARY *)0x0) {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar2 = av1_get_last_show_frame(cpi,(YV12_BUFFER_CONFIG *)0x1f14ac);
    if (iVar2 == 0) {
      yuvconfig2image((aom_image_t *)local_20,&local_f0,(void *)0x0);
      local_4 = AOM_CODEC_OK;
    }
    else {
      local_4 = AOM_CODEC_ERROR;
    }
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_get_new_frame_image(aom_codec_alg_priv_t *ctx,
                                                va_list args) {
  aom_image_t *new_img = va_arg(args, aom_image_t *);
  if (new_img) {
    YV12_BUFFER_CONFIG new_frame;
    AVxWorker *const worker = ctx->frame_worker;
    FrameWorkerData *const frame_worker_data = (FrameWorkerData *)worker->data1;

    if (av1_get_frame_to_show(frame_worker_data->pbi, &new_frame) == 0) {
      yuvconfig2image(new_img, &new_frame, NULL);
      return AOM_CODEC_OK;
    } else {
      return AOM_CODEC_ERROR;
    }
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}